

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void ZSTD_window_init(ZSTD_window_t *window)

{
  ZSTD_window_t *window_local;
  
  memset(window,0,0x28);
  window->base = "";
  window->dictBase = "";
  window->dictLimit = 1;
  window->lowLimit = 1;
  window->nextSrc = window->base + 1;
  window->nbOverflowCorrections = 0;
  return;
}

Assistant:

MEM_STATIC void ZSTD_window_init(ZSTD_window_t* window) {
    ZSTD_memset(window, 0, sizeof(*window));
    window->base = (BYTE const*)"";
    window->dictBase = (BYTE const*)"";
    window->dictLimit = 1;    /* start from 1, so that 1st position is valid */
    window->lowLimit = 1;     /* it ensures first and later CCtx usages compress the same */
    window->nextSrc = window->base + 1;   /* see issue #1241 */
    window->nbOverflowCorrections = 0;
}